

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopDivideByCube(Kit_Sop_t *cSop,Kit_Sop_t *cDiv,Kit_Sop_t *vQuo,Kit_Sop_t *vRem,
                        Vec_Int_t *vMemory)

{
  int iVar1;
  uint uSmall;
  uint uCube_00;
  uint *puVar2;
  bool bVar3;
  int local_3c;
  int i;
  uint uDiv;
  uint uCube;
  Vec_Int_t *vMemory_local;
  Kit_Sop_t *vRem_local;
  Kit_Sop_t *vQuo_local;
  Kit_Sop_t *cDiv_local;
  Kit_Sop_t *cSop_local;
  
  iVar1 = Kit_SopCubeNum(cDiv);
  if (iVar1 == 1) {
    uSmall = Kit_SopCube(cDiv,0);
    vQuo->nCubes = 0;
    iVar1 = Kit_SopCubeNum(cSop);
    puVar2 = Vec_IntFetch(vMemory,iVar1);
    vQuo->pCubes = puVar2;
    vRem->nCubes = 0;
    iVar1 = Kit_SopCubeNum(cSop);
    puVar2 = Vec_IntFetch(vMemory,iVar1);
    vRem->pCubes = puVar2;
    local_3c = 0;
    while( true ) {
      iVar1 = Kit_SopCubeNum(cSop);
      bVar3 = false;
      if (local_3c < iVar1) {
        i = Kit_SopCube(cSop,local_3c);
        bVar3 = i != 0;
      }
      if (!bVar3) break;
      iVar1 = Kit_CubeContains(i,uSmall);
      if (iVar1 == 0) {
        Kit_SopPushCube(vRem,i);
      }
      else {
        uCube_00 = Kit_CubeSharp(i,uSmall);
        Kit_SopPushCube(vQuo,uCube_00);
      }
      local_3c = local_3c + 1;
    }
    return;
  }
  __assert_fail("Kit_SopCubeNum(cDiv) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                ,0x96,
                "void Kit_SopDivideByCube(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
               );
}

Assistant:

void Kit_SopDivideByCube( Kit_Sop_t * cSop, Kit_Sop_t * cDiv, Kit_Sop_t * vQuo, Kit_Sop_t * vRem, Vec_Int_t * vMemory )
{
    unsigned uCube, uDiv;
    int i;
    // get the only cube
    assert( Kit_SopCubeNum(cDiv) == 1 );
    uDiv = Kit_SopCube(cDiv, 0);
    // allocate covers
    vQuo->nCubes = 0;
    vQuo->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    vRem->nCubes = 0;
    vRem->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    // sort the cubes
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( Kit_CubeContains( uCube, uDiv ) )
            Kit_SopPushCube( vQuo, Kit_CubeSharp(uCube, uDiv) );
        else
            Kit_SopPushCube( vRem, uCube );
    }
}